

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O2

double __thiscall CTB<UF>::Alloc(CTB<UF> *this)

{
  PerformanceEvaluator *perf;
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  double dVar6;
  Size local_80;
  Mat local_78 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  perf = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  dVar6 = UF::Alloc(((*(int *)&pMVar4->field_0x8 + 1) / 2) * ((*(int *)&pMVar4->field_0xc + 1) / 2)
                    + 1,perf);
  PerformanceEvaluator::start(perf);
  uVar1 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_80.height = (int)uVar1;
  local_80.width = (int)((ulong)uVar1 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_78,&local_80);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_78);
  cv::Mat::~Mat(local_78);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  PerformanceEvaluator::stop(perf);
  dVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  dVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  PerformanceEvaluator::start(perf);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  PerformanceEvaluator::stop(perf);
  return dVar6 + ((dVar2 * 1000.0) / dVar3 -
                 ((this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.
                  last * 1000.0) /
                 (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.
                 tick_frequency_);
}

Assistant:

double Alloc()
    {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double ma_t = t - perf_.last();
        // Return total time
        return ls_t + ma_t;
    }